

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupRemapCis(Gia_Man_t *pNew,Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Gia_Obj_t *p_01;
  bool bVar3;
  int local_2c;
  int i;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Vec_IntSize(p->vCis);
  iVar2 = Vec_IntSize(pNew->vCis);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(p->vCis) == Vec_IntSize(pNew->vCis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x7f,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar3 = false;
    if (local_2c < iVar1) {
      pObjNew = Gia_ManCi(p,local_2c);
      bVar3 = pObjNew != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) {
      return;
    }
    iVar1 = Gia_ObjCioId(pObjNew);
    if (iVar1 != local_2c) {
      __assert_fail("Gia_ObjCioId(pObj) == i",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                    ,0x82,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
    }
    p_01 = Gia_ObjFromLit(pNew,pObjNew->Value);
    iVar1 = Gia_IsComplement(p_01);
    if (iVar1 != 0) break;
    p_00 = pNew->vCis;
    iVar1 = Gia_ObjId(pNew,p_01);
    Vec_IntWriteEntry(p_00,local_2c,iVar1);
    Gia_ObjSetCioId(p_01,local_2c);
    local_2c = local_2c + 1;
  }
  __assert_fail("!Gia_IsComplement(pObjNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                ,0x84,"void Gia_ManDupRemapCis(Gia_Man_t *, Gia_Man_t *)");
}

Assistant:

void Gia_ManDupRemapCis( Gia_Man_t * pNew, Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjNew;
    int i;
    assert( Vec_IntSize(p->vCis) == Vec_IntSize(pNew->vCis) );
    Gia_ManForEachCi( p, pObj, i )
    {
        assert( Gia_ObjCioId(pObj) == i );
        pObjNew = Gia_ObjFromLit( pNew, pObj->Value );
        assert( !Gia_IsComplement(pObjNew) );
        Vec_IntWriteEntry( pNew->vCis, i, Gia_ObjId(pNew, pObjNew) );
        Gia_ObjSetCioId( pObjNew, i );
    }
}